

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvDoErrorTest(CVodeMem cv_mem,int *nflagPtr,sunrealtype saved_t,sunrealtype acor_nrm,int *nefPtr
                 ,long *netfPtr,sunrealtype *dsmPtr)

{
  void *pvVar1;
  int iVar2;
  long *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  N_Vector in_R8;
  double in_XMM1_Qa;
  double dVar3;
  N_Vector wrk2;
  N_Vector wrk1;
  int is;
  int retval;
  sunrealtype dsm;
  sunrealtype in_stack_ffffffffffffff58;
  CVodeMem in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  N_Vector in_stack_ffffffffffffff78;
  undefined8 uVar4;
  N_Vector *in_stack_ffffffffffffff80;
  N_Vector *in_stack_ffffffffffffff88;
  N_Vector in_stack_ffffffffffffff90;
  N_Vector in_stack_ffffffffffffff98;
  int local_50;
  int local_4;
  
  pvVar1 = (void *)(in_XMM1_Qa * *(double *)(in_RDI + 0x498));
  in_R8->content = pvVar1;
  if (1.0 < (double)pvVar1) {
    *in_RDX = *in_RDX + 1;
    *in_RCX = *in_RCX + 1;
    *in_RSI = 9;
    cvRestore(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if ((ABS(*(double *)(in_RDI + 0x3e0)) <= *(double *)(in_RDI + 0x5b8) * 1.000001) ||
       (*in_RDX == *(int *)(in_RDI + 0x5ac))) {
      local_4 = -3;
    }
    else {
      *(undefined8 *)(in_RDI + 0x5c8) = 0x3ff0000000000000;
      if (*in_RDX < 4) {
        dVar3 = (double)SUNRpowerR(SUB84((double)pvVar1 * 6.0,0),
                                   1.0 / (double)*(int *)(in_RDI + 0x3d0));
        *(double *)(in_RDI + 0x3f8) = 1.0 / (dVar3 + 1e-06);
        if (*(double *)(in_RDI + 0x3f8) <=
            *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0))) {
          dVar3 = *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0));
        }
        else {
          dVar3 = *(double *)(in_RDI + 0x3f8);
        }
        if (*(double *)(in_RDI + 0x600) <= dVar3) {
          if (*(double *)(in_RDI + 0x3f8) <=
              *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0))) {
            dVar3 = *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0));
          }
          else {
            dVar3 = *(double *)(in_RDI + 0x3f8);
          }
        }
        else {
          dVar3 = *(double *)(in_RDI + 0x600);
        }
        *(double *)(in_RDI + 0x3f8) = dVar3;
        if (*(int *)(in_RDI + 0x620) <= *in_RDX) {
          if (*(double *)(in_RDI + 0x608) <= *(double *)(in_RDI + 0x3f8)) {
            uVar4 = *(undefined8 *)(in_RDI + 0x608);
          }
          else {
            uVar4 = *(undefined8 *)(in_RDI + 0x3f8);
          }
          *(undefined8 *)(in_RDI + 0x3f8) = uVar4;
        }
        cvRescale(in_stack_ffffffffffffff60);
        local_4 = 5;
      }
      else if (*(int *)(in_RDI + 0x3c0) < 2) {
        if (*(double *)(in_RDI + 0x600) <=
            *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0))) {
          local_98 = *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0));
        }
        else {
          local_98 = *(double *)(in_RDI + 0x600);
        }
        *(double *)(in_RDI + 0x3f8) = local_98;
        *(double *)(in_RDI + 0x3e0) = *(double *)(in_RDI + 0x3f8) * *(double *)(in_RDI + 0x3e0);
        *(undefined8 *)(in_RDI + 0x3f0) = *(undefined8 *)(in_RDI + 0x3e0);
        *(undefined8 *)(in_RDI + 0x400) = *(undefined8 *)(in_RDI + 0x3e0);
        *(undefined4 *)(in_RDI + 0x3cc) = 10;
        *(undefined4 *)(in_RDI + 0x948) = 0;
        iVar2 = (**(code **)(in_RDI + 0x10))
                          ((int)*(undefined8 *)(in_RDI + 0x408),*(undefined8 *)(in_RDI + 0x150),
                           *(undefined8 *)(in_RDI + 0x1d0),*(undefined8 *)(in_RDI + 0x18));
        *(long *)(in_RDI + 0x630) = *(long *)(in_RDI + 0x630) + 1;
        if (iVar2 < 0) {
          local_4 = -8;
        }
        else if (iVar2 < 1) {
          N_VScale((int)*(undefined8 *)(in_RDI + 0x3e0),*(undefined8 *)(in_RDI + 0x1d0),
                   *(undefined8 *)(in_RDI + 0x158));
          if (*(int *)(in_RDI + 0x5c) != 0) {
            iVar2 = (**(code **)(in_RDI + 0x60))
                              ((int)*(undefined8 *)(in_RDI + 0x408),*(undefined8 *)(in_RDI + 0x150),
                               *(undefined8 *)(in_RDI + 0x280),*(undefined8 *)(in_RDI + 0x18));
            *(long *)(in_RDI + 0x638) = *(long *)(in_RDI + 0x638) + 1;
            if (iVar2 < 0) {
              return -0x1f;
            }
            if (0 < iVar2) {
              return -0x22;
            }
            N_VScale((int)*(undefined8 *)(in_RDI + 0x3e0),*(undefined8 *)(in_RDI + 0x280),
                     *(undefined8 *)(in_RDI + 0x208));
          }
          if (*(int *)(in_RDI + 0x8c) != 0) {
            iVar2 = cvSensRhsWrapper(*(CVodeMem *)(in_RDI + 0x1d8),
                                     **(sunrealtype **)(in_RDI + 0x310),in_stack_ffffffffffffff98,
                                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_R8);
            if (iVar2 < 0) {
              return -0x29;
            }
            if (0 < iVar2) {
              return -0x2c;
            }
            for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x90); local_50 = local_50 + 1) {
              *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)local_50 * 8) =
                   *(undefined8 *)(in_RDI + 0x3e0);
            }
            iVar2 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x90),
                                        *(undefined8 *)(in_RDI + 0xa50),
                                        *(undefined8 *)(in_RDI + 0x308),
                                        *(undefined8 *)(in_RDI + 0x290));
            if (iVar2 != 0) {
              return -0x1c;
            }
          }
          if (*(int *)(in_RDI + 0x108) != 0) {
            iVar2 = (**(code **)(in_RDI + 0x110))
                              ((int)*(undefined8 *)(in_RDI + 0x408),*(undefined4 *)(in_RDI + 0x90),
                               *(undefined8 *)(in_RDI + 0x150),*(undefined8 *)(in_RDI + 0x288),
                               *(undefined8 *)(in_RDI + 0x280),*(undefined8 *)(in_RDI + 0x3a0),
                               *(undefined8 *)(in_RDI + 0x118),*(undefined8 *)(in_RDI + 0x1d8),
                               *(undefined8 *)(in_RDI + 0x3a8));
            *(long *)(in_RDI + 0x650) = *(long *)(in_RDI + 0x650) + 1;
            if (iVar2 < 0) {
              return -0x33;
            }
            if (0 < iVar2) {
              return -0x36;
            }
            for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x90); local_50 = local_50 + 1) {
              *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)local_50 * 8) =
                   *(undefined8 *)(in_RDI + 0x3e0);
            }
            iVar2 = N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x90),
                                        *(undefined8 *)(in_RDI + 0xa50),
                                        *(undefined8 *)(in_RDI + 0x3a0),
                                        *(undefined8 *)(in_RDI + 0x328));
            if (iVar2 != 0) {
              return -0x1c;
            }
          }
          local_4 = 5;
        }
        else {
          local_4 = -0xb;
        }
      }
      else {
        if (*(double *)(in_RDI + 0x600) <=
            *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0))) {
          local_90 = *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0));
        }
        else {
          local_90 = *(double *)(in_RDI + 0x600);
        }
        *(double *)(in_RDI + 0x3f8) = local_90;
        cvAdjustOrder(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        *(undefined4 *)(in_RDI + 0x3d0) = *(undefined4 *)(in_RDI + 0x3c0);
        *(int *)(in_RDI + 0x3c0) = *(int *)(in_RDI + 0x3c0) + -1;
        *(undefined4 *)(in_RDI + 0x3cc) = *(undefined4 *)(in_RDI + 0x3d0);
        cvRescale(in_stack_ffffffffffffff60);
        local_4 = 5;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cvDoErrorTest(CVodeMem cv_mem, int* nflagPtr, sunrealtype saved_t,
                         sunrealtype acor_nrm, int* nefPtr, long int* netfPtr,
                         sunrealtype* dsmPtr)
{
  sunrealtype dsm;
  int retval, is;
  N_Vector wrk1, wrk2;

  dsm = acor_nrm * cv_mem->cv_tq[2];

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                     "error-test", "step = %li, h = %.16g, dsm = %.16g",
                     cv_mem->cv_nst, cv_mem->cv_h, dsm);
#endif

  /* If est. local error norm dsm passes test, return CV_SUCCESS */
  *dsmPtr = dsm;
  if (dsm <= ONE) { return (CV_SUCCESS); }

  /* Test failed; increment counters, set nflag, and restore zn array */
  (*nefPtr)++;
  (*netfPtr)++;
  *nflagPtr = PREV_ERR_FAIL;
  cvRestore(cv_mem, saved_t);

  /* At maxnef failures or |h| = hmin, return CV_ERR_FAILURE */
  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*nefPtr == cv_mem->cv_maxnef))
  {
    return (CV_ERR_FAILURE);
  }

  /* Set etamax = 1 to prevent step size increase at end of this step */
  cv_mem->cv_etamax = ONE;

  /* Set h ratio eta from dsm, rescale, and return for retry of step */
  if (*nefPtr <= MXNEF1)
  {
    cv_mem->cv_eta = ONE / (SUNRpowerR(BIAS2 * dsm, ONE / cv_mem->cv_L) + ADDON);
    cv_mem->cv_eta =
      SUNMAX(cv_mem->cv_eta_min_ef,
             SUNMAX(cv_mem->cv_eta, cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h)));
    if (*nefPtr >= cv_mem->cv_small_nef)
    {
      cv_mem->cv_eta = SUNMIN(cv_mem->cv_eta, cv_mem->cv_eta_max_ef);
    }

    cvRescale(cv_mem);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                       "new-step-eta", "eta = %.16g", cv_mem->cv_eta);
#endif

    return (TRY_AGAIN);
  }

  /* After MXNEF1 failures, force an order reduction and retry step */
  if (cv_mem->cv_q > 1)
  {
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
    cvAdjustOrder(cv_mem, -1);
    cv_mem->cv_L = cv_mem->cv_q;
    cv_mem->cv_q--;
    cv_mem->cv_qwait = cv_mem->cv_L;
    cvRescale(cv_mem);
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                       "new-step-eta-mxnef1", "eta = %.16g", cv_mem->cv_eta);
#endif
    return (TRY_AGAIN);
  }

  /* If already at order 1, restart: reload zn, znQ, znS, znQS from scratch */

  cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                          cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  cv_mem->cv_h *= cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_qwait  = LONG_WAIT;
  cv_mem->cv_nscon  = 0;

  retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempv,
                        cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) { return (CV_RHSFUNC_FAIL); }
  if (retval > 0) { return (CV_UNREC_RHSFUNC_ERR); }

  N_VScale(cv_mem->cv_h, cv_mem->cv_tempv, cv_mem->cv_zn[1]);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODES::cvDoErrorTest",
                     "new-step-eta-mxnef1-q1", "eta = %.16g", cv_mem->cv_eta);
#endif

  if (cv_mem->cv_quadr)
  {
    retval = cv_mem->cv_fQ(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempvQ,
                           cv_mem->cv_user_data);
    cv_mem->cv_nfQe++;
    if (retval < 0) { return (CV_QRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QRHSFUNC_ERR); }

    N_VScale(cv_mem->cv_h, cv_mem->cv_tempvQ, cv_mem->cv_znQ[1]);
  }

  if (cv_mem->cv_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempS[0];

    retval = cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, cv_mem->cv_zn[0],
                              cv_mem->cv_tempv, cv_mem->cv_znS[0],
                              cv_mem->cv_tempvS, wrk1, wrk2);
    if (retval < 0) { return (CV_SRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_SRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvS, cv_mem->cv_znS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempQ;

    retval = cv_mem->cv_fQS(cv_mem->cv_Ns, cv_mem->cv_tn, cv_mem->cv_zn[0],
                            cv_mem->cv_znS[0], cv_mem->cv_tempvQ,
                            cv_mem->cv_tempvQS, cv_mem->cv_fQS_data, wrk1, wrk2);
    cv_mem->cv_nfQSe++;
    if (retval < 0) { return (CV_QSRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QSRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvQS, cv_mem->cv_znQS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (TRY_AGAIN);
}